

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O3

int stdout_close(int handle)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = fwrite(memTable[handle].memaddr,1,memTable[handle].fitsfilesize,_stdout);
  iVar2 = 0;
  if (sVar1 != memTable[handle].fitsfilesize) {
    ffpmsg("failed to copy memory file to stdout (stdout_close)");
    iVar2 = 0x6a;
  }
  free(memTable[handle].memaddr);
  memTable[handle].memaddrptr = (char **)0x0;
  memTable[handle].memaddr = (char *)0x0;
  return iVar2;
}

Assistant:

int stdout_close(int handle)
/*
  copy the memory file to stdout, then free the memory
*/
{
    int status = 0;

    /* copy from memory to standard out.  explicit LONGLONG->size_t cast */
    if(fwrite(memTable[handle].memaddr, 1,
              ((size_t) memTable[handle].fitsfilesize), stdout) !=
              (size_t) memTable[handle].fitsfilesize )
    {
                ffpmsg("failed to copy memory file to stdout (stdout_close)");
                status = WRITE_ERROR;
    }

    free( memTable[handle].memaddr );   /* free the memory */
    memTable[handle].memaddrptr = 0;
    memTable[handle].memaddr = 0;
    return(status);
}